

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::~Worker(Worker *this)

{
  bool bVar1;
  element_type *this_00;
  Worker *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->thread_);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->thread_);
    bVar1 = WorkerThread::Joinable(this_00);
    if (bVar1) {
      Close(this);
      Join(this);
    }
  }
  Signaler::~Signaler(&this->signal_);
  std::
  map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
  ::~map(&this->ongoing_);
  std::
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::~deque(&this->queue_);
  std::shared_ptr<restincurl::Worker::WorkerThread>::~shared_ptr(&this->thread_);
  return;
}

Assistant:

~Worker() {
            if (thread_ && thread_->Joinable()) {
                Close();
                Join();
            }
        }